

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
Execute<duckdb::timestamp_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::hugeint_t>>
          (ArgMinMaxBase<duckdb::GreaterThan,true> *this,
          ArgMinMaxState<duckdb::timestamp_t,_duckdb::hugeint_t> *state,timestamp_t x_data,
          hugeint_t y_data,AggregateBinaryInput *binary)

{
  uint64_t uVar1;
  
  uVar1 = y_data.lower;
  if (((long)*(uint64_t *)(this + 0x18) < (long)uVar1) ||
     (*(ulong *)(this + 0x10) < (ulong)x_data.value && *(uint64_t *)(this + 0x18) == uVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (*(TemplatedValidityMask<unsigned_long> **)(y_data.upper + 8),
               *(idx_t *)(y_data.upper + 0x18));
    *(ArgMinMaxState<duckdb::timestamp_t,_duckdb::hugeint_t> **)(this + 8) = state;
    *(int64_t *)(this + 0x10) = x_data.value;
    *(uint64_t *)(this + 0x18) = uVar1;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}